

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# padding_x86_avx2.cpp
# Opt level: O2

int __thiscall
ncnn::Padding_x86_avx2::forward(Padding_x86_avx2 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float *pfVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  __m256 v;
  __m256 v_00;
  __m256 _v;
  __m256 v_01;
  __m256 _v_00;
  __m256 v_02;
  float _v_01 [4];
  int iVar4;
  uint uVar5;
  uint uVar6;
  _func_int **pp_Var7;
  sbyte sVar8;
  int iVar9;
  undefined1 (*pauVar10) [32];
  undefined1 (*pauVar11) [16];
  ulong uVar12;
  ulong uVar13;
  int z;
  int iVar14;
  long lVar15;
  int iVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  undefined1 (*pauVar20) [32];
  undefined1 (*pauVar21) [16];
  _func_int *p_Var22;
  int y;
  int x_1;
  int iVar23;
  int iVar24;
  undefined1 (*pauVar25) [32];
  undefined1 (*pauVar26) [16];
  int x_2;
  int iVar27;
  long lVar28;
  long lVar29;
  int x;
  long lVar30;
  ulong uVar31;
  bool bVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float _v_02 [4];
  float fVar36;
  undefined8 in_XMM1_Qa;
  __m128 v_03;
  __m128 v_04;
  __m128 v_05;
  __m128 v_06;
  Padding_x86_avx2 *pPVar37;
  Mat *pMVar38;
  int _c;
  undefined4 uVar39;
  undefined8 in_stack_fffffffffffffea0;
  Mat m;
  Mat bottom_blob_unpacked;
  Mat local_78;
  
  p_Var22 = this->_vptr_Padding_x86_avx2[-3];
  uVar5 = *(uint *)(&this->field_0xd0 + (long)p_Var22);
  if (((((uVar5 == 0) && (*(int *)(&this->field_0xd4 + (long)p_Var22) == 0)) &&
       (*(int *)(&this->field_0xd8 + (long)p_Var22) == 0)) &&
      ((*(int *)(&this->field_0xdc + (long)p_Var22) == 0 &&
       (*(int *)(&this->field_0xe8 + (long)p_Var22) == 0)))) &&
     (*(int *)(&this->field_0xec + (long)p_Var22) == 0)) {
    Mat::operator=(top_blob,bottom_blob);
    return 0;
  }
  iVar4 = bottom_blob->elempack;
  if (iVar4 != 0) {
    uVar31 = bottom_blob->elemsize;
    if (((int)uVar31 * 8) / iVar4 == 8) {
      iVar4 = forward_int8(this,bottom_blob,top_blob,opt);
      return iVar4;
    }
    iVar14 = bottom_blob->w;
    iVar9 = bottom_blob->h;
    iVar23 = bottom_blob->d;
    _c = bottom_blob->c;
    uVar39 = 0;
    if (iVar4 == 4) {
      switch(bottom_blob->dims) {
      case 1:
        uVar5 = *(uint *)(&this->field_0xd8 + (long)p_Var22) + iVar14 * 4 +
                *(int *)(&this->field_0xdc + (long)p_Var22);
        sVar8 = ((uVar5 & 3) == 0) * '\x02';
        if ((uVar5 & 7) == 0) {
          sVar8 = 3;
        }
        if ((((*(uint *)(&this->field_0xd8 + (long)p_Var22) & 3) == 0) && ((uVar5 & 7) == 4)) &&
           (*(int *)(&this->field_0xe0 + (long)p_Var22) == 0)) {
          Mat::create(top_blob,(int)uVar5 >> 2,(uVar31 >> 2) << sVar8,4,opt->blob_allocator);
          if (top_blob->data == (void *)0x0) {
            return -100;
          }
          if ((long)top_blob->c * top_blob->cstep != 0) {
            p_Var22 = this->_vptr_Padding_x86_avx2[-3];
            v_03[1] = (float)*(undefined4 *)(&this->field_0xe4 + (long)p_Var22);
            v_03[0] = (float)*(undefined4 *)(&this->field_0xe4 + (long)p_Var22);
            v_03[2] = (float)(int)in_XMM1_Qa;
            v_03[3] = (float)(int)((ulong)in_XMM1_Qa >> 0x20);
            padding_constant_pack4_sse
                      (bottom_blob,top_blob,0,0,*(int *)(&this->field_0xd8 + (long)p_Var22) / 4,
                       *(int *)(&this->field_0xdc + (long)p_Var22) / 4,v_03);
            return 0;
          }
          return -100;
        }
        break;
      case 2:
        uVar6 = uVar5 + iVar9 * 4 + *(int *)(&this->field_0xd4 + (long)p_Var22);
        sVar8 = ((uVar6 & 3) == 0) * '\x02';
        if ((uVar6 & 7) == 0) {
          sVar8 = 3;
        }
        if ((((uVar5 & 3) == 0) && ((uVar6 & 7) == 4)) &&
           (*(int *)(&this->field_0xe0 + (long)p_Var22) == 0)) {
          Mat::create(top_blob,iVar14 + *(int *)(&this->field_0xd8 + (long)p_Var22) +
                               *(int *)(&this->field_0xdc + (long)p_Var22),(int)uVar6 >> 2,
                      (uVar31 >> 2) << sVar8,4,opt->blob_allocator);
          if (top_blob->data == (void *)0x0) {
            return -100;
          }
          if ((long)top_blob->c * top_blob->cstep != 0) {
            p_Var22 = this->_vptr_Padding_x86_avx2[-3];
            v_06[1] = (float)*(undefined4 *)(&this->field_0xe4 + (long)p_Var22);
            v_06[0] = (float)*(undefined4 *)(&this->field_0xe4 + (long)p_Var22);
            v_06[2] = (float)(int)in_XMM1_Qa;
            v_06[3] = (float)(int)((ulong)in_XMM1_Qa >> 0x20);
            padding_constant_pack4_sse
                      (bottom_blob,top_blob,*(int *)(&this->field_0xd0 + (long)p_Var22) / 4,
                       *(int *)(&this->field_0xd4 + (long)p_Var22) / 4,
                       *(int *)(&this->field_0xd8 + (long)p_Var22),
                       *(int *)(&this->field_0xdc + (long)p_Var22),v_06);
            return 0;
          }
          return -100;
        }
        break;
      case 3:
        uVar6 = *(uint *)(&this->field_0xe8 + (long)p_Var22) + _c * 4 +
                *(int *)(&this->field_0xec + (long)p_Var22);
        sVar8 = ((uVar6 & 3) == 0) * '\x02';
        if ((uVar6 & 7) == 0) {
          sVar8 = 3;
        }
        if (((*(uint *)(&this->field_0xe8 + (long)p_Var22) & 3) == 0) && ((uVar6 & 7) == 4)) {
          if ((uVar6 == _c * 4) || (*(int *)(&this->field_0xe0 + (long)p_Var22) == 0)) {
            uVar6 = (int)uVar6 >> 2;
            Mat::create(top_blob,iVar14 + *(int *)(&this->field_0xd8 + (long)p_Var22) +
                                 *(int *)(&this->field_0xdc + (long)p_Var22),
                        uVar5 + iVar9 + *(int *)(&this->field_0xd4 + (long)p_Var22),uVar6,
                        (uVar31 >> 2) << sVar8,4,opt->blob_allocator);
            if (top_blob->data == (void *)0x0) {
              return -100;
            }
            if ((long)top_blob->c * top_blob->cstep != 0) {
              iVar4 = *(int *)(&this->field_0xe8 + (long)this->_vptr_Padding_x86_avx2[-3]);
              if ((int)uVar6 < 1) {
                uVar6 = 0;
              }
              lVar15 = -0x20;
              for (uVar31 = 0; uVar31 != uVar6; uVar31 = uVar31 + 1) {
                Mat::channel(&bottom_blob_unpacked,top_blob,(int)uVar31);
                p_Var22 = this->_vptr_Padding_x86_avx2[-3];
                if (*(int *)(&this->field_0xf0 + (long)p_Var22) == 0) {
                  fVar33 = *(float *)(&this->field_0xe4 + (long)p_Var22);
                  _v_02[1] = fVar33;
                  _v_02[0] = fVar33;
                  _v_02[2] = fVar33;
                  _v_02[3] = fVar33;
                }
                else {
                  _v_02 = *(float (*) [4])
                           (*(long *)(&this->field_0xf8 + (long)p_Var22) + uVar31 * 0x10);
                }
                iVar14 = iVar4 / -4 + (int)uVar31;
                if (iVar14 < 0 || _c <= iVar14) {
                  Mat::fill<float__vector(4)>(&bottom_blob_unpacked,_v_02);
                }
                else {
                  Mat::channel(&m,bottom_blob,iVar14);
                  pp_Var7 = this->_vptr_Padding_x86_avx2;
                  p_Var22 = pp_Var7[-3];
                  iVar14 = *(int *)(&this->field_0xe0 + (long)p_Var22);
                  if (iVar14 == 0) {
                    v_04._0_8_ = _v_02._0_8_;
                    v_04[2] = (float)(int)in_XMM1_Qa;
                    v_04[3] = (float)(int)((ulong)in_XMM1_Qa >> 0x20);
                    pPVar37 = this;
                    padding_constant_pack4_sse
                              (&m,&bottom_blob_unpacked,*(int *)(&this->field_0xd0 + (long)p_Var22),
                               *(int *)(&this->field_0xd4 + (long)p_Var22),
                               *(int *)(&this->field_0xd8 + (long)p_Var22),
                               *(int *)(&this->field_0xdc + (long)p_Var22),v_04);
                    pp_Var7 = this->_vptr_Padding_x86_avx2;
                    p_Var22 = pp_Var7[-3];
                    iVar14 = *(int *)(&this->field_0xe0 + (long)p_Var22);
                    this = pPVar37;
                  }
                  if (iVar14 == 1) {
                    iVar14 = *(int *)(&this->field_0xd4 + (long)p_Var22);
                    iVar23 = 0;
                    iVar9 = *(int *)(&this->field_0xd8 + (long)p_Var22);
                    if (*(int *)(&this->field_0xd8 + (long)p_Var22) < 1) {
                      iVar9 = 0;
                    }
                    iVar16 = *(int *)(&this->field_0xdc + (long)p_Var22);
                    if (*(int *)(&this->field_0xdc + (long)p_Var22) < 1) {
                      iVar16 = 0;
                    }
                    pauVar11 = (undefined1 (*) [16])bottom_blob_unpacked.data;
                    iVar24 = *(int *)(&this->field_0xd0 + (long)p_Var22);
                    if (*(int *)(&this->field_0xd0 + (long)p_Var22) < 1) {
                      iVar24 = iVar23;
                    }
                    for (; iVar23 != iVar24; iVar23 = iVar23 + 1) {
                      auVar2 = *m.data;
                      iVar27 = iVar9;
                      while (bVar32 = iVar27 != 0, iVar27 = iVar27 + -1, bVar32) {
                        *pauVar11 = auVar2;
                        pauVar11 = pauVar11 + 1;
                      }
                      lVar28 = 0;
                      for (iVar27 = 0; iVar27 < m.w; iVar27 = iVar27 + 1) {
                        auVar2 = *(undefined1 (*) [16])((long)m.data + lVar28);
                        *(undefined1 (*) [16])(*pauVar11 + lVar28) = auVar2;
                        lVar28 = lVar28 + 0x10;
                      }
                      pauVar11 = (undefined1 (*) [16])(*pauVar11 + lVar28);
                      iVar27 = iVar16;
                      while (bVar32 = iVar27 != 0, iVar27 = iVar27 + -1, bVar32) {
                        *pauVar11 = auVar2;
                        pauVar11 = pauVar11 + 1;
                      }
                    }
                    pauVar21 = (undefined1 (*) [16])m.data;
                    for (iVar23 = 0; iVar23 < m.h; iVar23 = iVar23 + 1) {
                      auVar2 = *pauVar21;
                      iVar24 = iVar9;
                      while (bVar32 = iVar24 != 0, iVar24 = iVar24 + -1, bVar32) {
                        *pauVar11 = auVar2;
                        pauVar11 = pauVar11 + 1;
                      }
                      for (iVar24 = 0; iVar27 = iVar16, iVar24 < m.w; iVar24 = iVar24 + 1) {
                        auVar2 = *pauVar21;
                        *pauVar11 = auVar2;
                        pauVar21 = pauVar21 + 1;
                        pauVar11 = pauVar11 + 1;
                      }
                      while (iVar27 != 0) {
                        *pauVar11 = auVar2;
                        pauVar11 = pauVar11 + 1;
                        iVar27 = iVar27 + -1;
                      }
                    }
                    pauVar21 = (undefined1 (*) [16])((long)pauVar21 + (long)(m.w << 2) * -4);
                    iVar23 = 0;
                    if (iVar14 < 1) {
                      iVar14 = iVar23;
                    }
                    for (; iVar23 != iVar14; iVar23 = iVar23 + 1) {
                      auVar2 = *pauVar21;
                      iVar24 = iVar9;
                      while (bVar32 = iVar24 != 0, iVar24 = iVar24 + -1, bVar32) {
                        *pauVar11 = auVar2;
                        pauVar11 = pauVar11 + 1;
                      }
                      lVar28 = 0;
                      for (iVar24 = 0; iVar24 < m.w; iVar24 = iVar24 + 1) {
                        auVar2 = *(undefined1 (*) [16])(*pauVar21 + lVar28);
                        *(undefined1 (*) [16])(*pauVar11 + lVar28) = auVar2;
                        lVar28 = lVar28 + 0x10;
                      }
                      pauVar11 = (undefined1 (*) [16])(*pauVar11 + lVar28);
                      iVar24 = iVar16;
                      while (bVar32 = iVar24 != 0, iVar24 = iVar24 + -1, bVar32) {
                        *pauVar11 = auVar2;
                        pauVar11 = pauVar11 + 1;
                      }
                    }
                    p_Var22 = pp_Var7[-3];
                    iVar14 = *(int *)(&this->field_0xe0 + (long)p_Var22);
                  }
                  if (iVar14 == 2) {
                    iVar14 = *(int *)(&this->field_0xd0 + (long)p_Var22);
                    uVar5 = *(uint *)(&this->field_0xd8 + (long)p_Var22);
                    pauVar11 = (undefined1 (*) [16])((long)(m.w * iVar14 * 4) * 4 + (long)m.data);
                    uVar12 = 0;
                    uVar13 = 0;
                    if (0 < (int)uVar5) {
                      uVar13 = (ulong)uVar5;
                    }
                    uVar19 = (ulong)*(uint *)(&this->field_0xdc + (long)p_Var22);
                    if ((int)*(uint *)(&this->field_0xdc + (long)p_Var22) < 1) {
                      uVar19 = uVar12;
                    }
                    iVar9 = *(int *)(&this->field_0xd4 + (long)p_Var22);
                    if (iVar14 < 1) {
                      iVar14 = 0;
                    }
                    lVar28 = uVar13 * 0x10;
                    lVar18 = uVar19 * 0x10;
                    pauVar21 = (undefined1 (*) [16])bottom_blob_unpacked.data;
                    for (; (int)uVar12 != iVar14; uVar12 = (ulong)((int)uVar12 + 1)) {
                      lVar29 = 0;
                      for (lVar30 = 0; lVar28 + lVar30 != 0; lVar30 = lVar30 + -0x10) {
                        *(undefined1 (*) [16])(*pauVar21 + lVar29) =
                             *(undefined1 (*) [16])(pauVar11[(int)uVar5] + lVar30);
                        lVar29 = lVar29 + 0x10;
                      }
                      pauVar21 = (undefined1 (*) [16])((long)pauVar21 - lVar30);
                      pauVar26 = pauVar11;
                      for (iVar23 = 0; lVar29 = lVar15, iVar23 < m.w; iVar23 = iVar23 + 1) {
                        *pauVar21 = *pauVar26;
                        pauVar26 = pauVar26 + 1;
                        pauVar21 = pauVar21 + 1;
                      }
                      for (; lVar18 + lVar29 != -0x20; lVar29 = lVar29 + -0x10) {
                        *pauVar21 = *(undefined1 (*) [16])(*pauVar26 + lVar29);
                        pauVar21 = pauVar21 + 1;
                      }
                      pauVar11 = pauVar11 + -(long)m.w;
                    }
                    for (iVar14 = 0; iVar14 < m.h; iVar14 = iVar14 + 1) {
                      lVar30 = 0;
                      for (lVar29 = 0; lVar28 + lVar29 != 0; lVar29 = lVar29 + -0x10) {
                        *(undefined1 (*) [16])(*pauVar21 + lVar30) =
                             *(undefined1 (*) [16])(pauVar11[(int)uVar5] + lVar29);
                        lVar30 = lVar30 + 0x10;
                      }
                      pauVar21 = (undefined1 (*) [16])((long)pauVar21 - lVar29);
                      for (iVar23 = 0; lVar29 = lVar15, iVar23 < m.w; iVar23 = iVar23 + 1) {
                        *pauVar21 = *pauVar11;
                        pauVar11 = pauVar11 + 1;
                        pauVar21 = pauVar21 + 1;
                      }
                      for (; lVar18 + lVar29 != -0x20; lVar29 = lVar29 + -0x10) {
                        *pauVar21 = *(undefined1 (*) [16])(*pauVar11 + lVar29);
                        pauVar21 = pauVar21 + 1;
                      }
                    }
                    pauVar11 = pauVar11 + (long)m.w * -2;
                    iVar14 = 0;
                    if (iVar9 < 1) {
                      iVar9 = iVar14;
                    }
                    for (; iVar14 != iVar9; iVar14 = iVar14 + 1) {
                      lVar30 = 0;
                      for (lVar29 = 0; lVar28 + lVar29 != 0; lVar29 = lVar29 + -0x10) {
                        *(undefined1 (*) [16])(*pauVar21 + lVar30) =
                             *(undefined1 (*) [16])(pauVar11[(int)uVar5] + lVar29);
                        lVar30 = lVar30 + 0x10;
                      }
                      pauVar21 = (undefined1 (*) [16])((long)pauVar21 - lVar29);
                      pauVar26 = pauVar11;
                      for (iVar23 = 0; lVar29 = lVar15, iVar23 < m.w; iVar23 = iVar23 + 1) {
                        *pauVar21 = *pauVar26;
                        pauVar26 = pauVar26 + 1;
                        pauVar21 = pauVar21 + 1;
                      }
                      for (; lVar18 + lVar29 != -0x20; lVar29 = lVar29 + -0x10) {
                        *pauVar21 = *(undefined1 (*) [16])(*pauVar26 + lVar29);
                        pauVar21 = pauVar21 + 1;
                      }
                      pauVar11 = pauVar11 + -(long)m.w;
                    }
                  }
                  Mat::~Mat(&m);
                }
                Mat::~Mat(&bottom_blob_unpacked);
              }
              return 0;
            }
            return -100;
          }
        }
        break;
      case 4:
        if (*(int *)(&this->field_0xe0 + (long)p_Var22) == 0) {
          iVar4 = *(int *)(&this->field_0xe8 + (long)p_Var22) + iVar23 +
                  *(int *)(&this->field_0xec + (long)p_Var22);
          Mat::create(top_blob,iVar14 + *(int *)(&this->field_0xd8 + (long)p_Var22) +
                               *(int *)(&this->field_0xdc + (long)p_Var22),
                      uVar5 + iVar9 + *(int *)(&this->field_0xd4 + (long)p_Var22),iVar4,_c,uVar31,4,
                      opt->blob_allocator);
          if (top_blob->data == (void *)0x0) {
            return -100;
          }
          if ((long)top_blob->c * top_blob->cstep != 0) {
            if (iVar4 < 1) {
              iVar4 = 0;
            }
            if (_c < 1) {
              _c = 0;
            }
            uVar39 = 0;
            pPVar37 = this;
            pMVar38 = top_blob;
            for (lVar15 = 0; lVar15 != CONCAT44(uVar39,_c); lVar15 = lVar15 + 1) {
              p_Var22 = pPVar37->_vptr_Padding_x86_avx2[-3];
              if (*(int *)(&pPVar37->field_0xf0 + (long)p_Var22) == 0) {
                fVar33 = *(float *)(&pPVar37->field_0xe4 + (long)p_Var22);
                fVar34 = fVar33;
                fVar35 = fVar33;
                fVar36 = fVar33;
              }
              else {
                pfVar1 = (float *)(*(long *)(&pPVar37->field_0xf8 + (long)p_Var22) + lVar15 * 0x10);
                fVar33 = *pfVar1;
                fVar34 = pfVar1[1];
                fVar35 = pfVar1[2];
                fVar36 = pfVar1[3];
              }
              for (iVar14 = 0; iVar4 != iVar14; iVar14 = iVar14 + 1) {
                Mat::channel(&m,top_blob,(int)lVar15);
                Mat::depth(&bottom_blob_unpacked,&m,iVar14);
                Mat::~Mat(&m);
                iVar9 = iVar14 - *(int *)(&pPVar37->field_0xe8 +
                                         (long)pPVar37->_vptr_Padding_x86_avx2[-3]);
                if (iVar9 < 0 || iVar23 <= iVar9) {
                  _v_01[1] = fVar34;
                  _v_01[0] = fVar33;
                  _v_01[2] = fVar35;
                  _v_01[3] = fVar36;
                  Mat::fill<float__vector(4)>(&bottom_blob_unpacked,_v_01);
                  top_blob = pMVar38;
                }
                else {
                  Mat::channel(&local_78,bottom_blob,(int)lVar15);
                  Mat::depth(&m,&local_78,
                             iVar14 - *(int *)(&this->field_0xe8 +
                                              (long)this->_vptr_Padding_x86_avx2[-3]));
                  Mat::~Mat(&local_78);
                  p_Var22 = this->_vptr_Padding_x86_avx2[-3];
                  v_05[1] = fVar34;
                  v_05[0] = fVar33;
                  v_05[2] = (float)(int)in_XMM1_Qa;
                  v_05[3] = (float)(int)((ulong)in_XMM1_Qa >> 0x20);
                  padding_constant_pack4_sse
                            (&m,&bottom_blob_unpacked,*(int *)(&this->field_0xd0 + (long)p_Var22),
                             *(int *)(&this->field_0xd4 + (long)p_Var22),
                             *(int *)(&this->field_0xd8 + (long)p_Var22),
                             *(int *)(&this->field_0xdc + (long)p_Var22),v_05);
                  Mat::~Mat(&m);
                  top_blob = pMVar38;
                }
                Mat::~Mat(&bottom_blob_unpacked);
                pMVar38 = top_blob;
              }
            }
            return 0;
          }
          return -100;
        }
      }
    }
    else if (iVar4 == 8) {
      switch(bottom_blob->dims) {
      case 1:
        uVar5 = *(uint *)(&this->field_0xd8 + (long)p_Var22) + iVar14 * 8 +
                *(int *)(&this->field_0xdc + (long)p_Var22);
        sVar8 = ((uVar5 & 3) == 0) * '\x02';
        if ((uVar5 & 7) == 0) {
          sVar8 = 3;
        }
        if ((((*(uint *)(&this->field_0xd8 + (long)p_Var22) | uVar5) & 7) == 0) &&
           (*(int *)(&this->field_0xe0 + (long)p_Var22) == 0)) {
          Mat::create(top_blob,(int)uVar5 / 8,(uVar31 >> 3) << sVar8,8,opt->blob_allocator);
          if (top_blob->data == (void *)0x0) {
            return -100;
          }
          if ((long)top_blob->c * top_blob->cstep != 0) {
            v._8_8_ = top_blob;
            v._0_8_ = this;
            v[4] = (float)_c;
            v[5] = (float)uVar39;
            v[6] = (float)(int)in_stack_fffffffffffffea0;
            v[7] = (float)(int)((ulong)in_stack_fffffffffffffea0 >> 0x20);
            padding_constant_pack8_avx
                      (bottom_blob,top_blob,0,0,
                       *(int *)(&this->field_0xd8 + (long)this->_vptr_Padding_x86_avx2[-3]) / 8,
                       *(int *)(&this->field_0xdc + (long)this->_vptr_Padding_x86_avx2[-3]) / 8,v);
            return 0;
          }
          return -100;
        }
        break;
      case 2:
        uVar6 = uVar5 + iVar9 * 8 + *(int *)(&this->field_0xd4 + (long)p_Var22);
        sVar8 = ((uVar6 & 3) == 0) * '\x02';
        if ((uVar6 & 7) == 0) {
          sVar8 = 3;
        }
        if ((((uVar5 | uVar6) & 7) == 0) && (*(int *)(&this->field_0xe0 + (long)p_Var22) == 0)) {
          Mat::create(top_blob,iVar14 + *(int *)(&this->field_0xd8 + (long)p_Var22) +
                               *(int *)(&this->field_0xdc + (long)p_Var22),(int)uVar6 / 8,
                      (uVar31 >> 3) << sVar8,8,opt->blob_allocator);
          if (top_blob->data == (void *)0x0) {
            return -100;
          }
          if ((long)top_blob->c * top_blob->cstep != 0) {
            p_Var22 = this->_vptr_Padding_x86_avx2[-3];
            v_02._8_8_ = top_blob;
            v_02._0_8_ = this;
            v_02[4] = (float)_c;
            v_02[5] = (float)uVar39;
            v_02[6] = (float)(int)in_stack_fffffffffffffea0;
            v_02[7] = (float)(int)((ulong)in_stack_fffffffffffffea0 >> 0x20);
            padding_constant_pack8_avx
                      (bottom_blob,top_blob,*(int *)(&this->field_0xd0 + (long)p_Var22) / 8,
                       *(int *)(&this->field_0xd4 + (long)p_Var22) / 8,
                       *(int *)(&this->field_0xd8 + (long)p_Var22),
                       *(int *)(&this->field_0xdc + (long)p_Var22),v_02);
            return 0;
          }
          return -100;
        }
        break;
      case 3:
        uVar6 = *(uint *)(&this->field_0xe8 + (long)p_Var22) + _c * 8 +
                *(int *)(&this->field_0xec + (long)p_Var22);
        sVar8 = ((uVar6 & 3) == 0) * '\x02';
        if ((uVar6 & 7) == 0) {
          sVar8 = 3;
        }
        if (((*(uint *)(&this->field_0xe8 + (long)p_Var22) | uVar6) & 7) == 0) {
          if ((uVar6 == _c * 8) || (*(int *)(&this->field_0xe0 + (long)p_Var22) == 0)) {
            uVar13 = (long)(int)uVar6 / 8 & 0xffffffff;
            iVar4 = (int)((long)(int)uVar6 / 8);
            Mat::create(top_blob,iVar14 + *(int *)(&this->field_0xd8 + (long)p_Var22) +
                                 *(int *)(&this->field_0xdc + (long)p_Var22),
                        uVar5 + iVar9 + *(int *)(&this->field_0xd4 + (long)p_Var22),iVar4,
                        (uVar31 >> 3) << sVar8,8,opt->blob_allocator);
            if (top_blob->data == (void *)0x0) {
              return -100;
            }
            if ((long)top_blob->c * top_blob->cstep != 0) {
              iVar14 = *(int *)(&this->field_0xe8 + (long)this->_vptr_Padding_x86_avx2[-3]);
              if (iVar4 < 1) {
                uVar13 = 0;
              }
              lVar15 = -0x40;
              for (uVar31 = 0; uVar31 != uVar13; uVar31 = uVar31 + 1) {
                Mat::channel(&bottom_blob_unpacked,top_blob,(int)uVar31);
                iVar4 = iVar14 / -8 + (int)uVar31;
                if (iVar4 < 0 || _c <= iVar4) {
                  _v._8_8_ = top_blob;
                  _v._0_8_ = this;
                  _v[4] = (float)_c;
                  _v[5] = (float)uVar39;
                  _v._24_8_ = bottom_blob;
                  Mat::fill(&bottom_blob_unpacked,_v);
                }
                else {
                  Mat::channel(&m,bottom_blob,iVar4);
                  pp_Var7 = this->_vptr_Padding_x86_avx2;
                  p_Var22 = pp_Var7[-3];
                  iVar4 = *(int *)(&this->field_0xe0 + (long)p_Var22);
                  if (iVar4 == 0) {
                    v_00._8_8_ = top_blob;
                    v_00._0_8_ = this;
                    v_00[4] = (float)_c;
                    v_00[5] = (float)uVar39;
                    v_00._24_8_ = bottom_blob;
                    pPVar37 = this;
                    padding_constant_pack8_avx
                              (&m,&bottom_blob_unpacked,*(int *)(&this->field_0xd0 + (long)p_Var22),
                               *(int *)(&this->field_0xd4 + (long)p_Var22),
                               *(int *)(&this->field_0xd8 + (long)p_Var22),
                               *(int *)(&this->field_0xdc + (long)p_Var22),v_00);
                    pp_Var7 = this->_vptr_Padding_x86_avx2;
                    p_Var22 = pp_Var7[-3];
                    iVar4 = *(int *)(&this->field_0xe0 + (long)p_Var22);
                    this = pPVar37;
                  }
                  if (iVar4 == 1) {
                    iVar4 = *(int *)(&this->field_0xd4 + (long)p_Var22);
                    iVar23 = 0;
                    iVar9 = *(int *)(&this->field_0xd8 + (long)p_Var22);
                    if (*(int *)(&this->field_0xd8 + (long)p_Var22) < 1) {
                      iVar9 = 0;
                    }
                    iVar16 = *(int *)(&this->field_0xdc + (long)p_Var22);
                    if (*(int *)(&this->field_0xdc + (long)p_Var22) < 1) {
                      iVar16 = 0;
                    }
                    pauVar10 = (undefined1 (*) [32])bottom_blob_unpacked.data;
                    iVar24 = *(int *)(&this->field_0xd0 + (long)p_Var22);
                    if (*(int *)(&this->field_0xd0 + (long)p_Var22) < 1) {
                      iVar24 = iVar23;
                    }
                    for (; iVar23 != iVar24; iVar23 = iVar23 + 1) {
                      auVar3 = *m.data;
                      iVar27 = iVar9;
                      while (bVar32 = iVar27 != 0, iVar27 = iVar27 + -1, bVar32) {
                        *pauVar10 = auVar3;
                        pauVar10 = pauVar10 + 1;
                      }
                      lVar28 = 0;
                      for (iVar27 = 0; iVar27 < m.w; iVar27 = iVar27 + 1) {
                        auVar3 = *(undefined1 (*) [32])((long)m.data + lVar28);
                        *(undefined1 (*) [32])(*pauVar10 + lVar28) = auVar3;
                        lVar28 = lVar28 + 0x20;
                      }
                      pauVar10 = (undefined1 (*) [32])(*pauVar10 + lVar28);
                      iVar27 = iVar16;
                      while (bVar32 = iVar27 != 0, iVar27 = iVar27 + -1, bVar32) {
                        *pauVar10 = auVar3;
                        pauVar10 = pauVar10 + 1;
                      }
                    }
                    pauVar20 = (undefined1 (*) [32])m.data;
                    for (iVar23 = 0; iVar23 < m.h; iVar23 = iVar23 + 1) {
                      auVar3 = *pauVar20;
                      iVar24 = iVar9;
                      while (bVar32 = iVar24 != 0, iVar24 = iVar24 + -1, bVar32) {
                        *pauVar10 = auVar3;
                        pauVar10 = pauVar10 + 1;
                      }
                      for (iVar24 = 0; iVar27 = iVar16, iVar24 < m.w; iVar24 = iVar24 + 1) {
                        auVar3 = *pauVar20;
                        *pauVar10 = auVar3;
                        pauVar20 = pauVar20 + 1;
                        pauVar10 = pauVar10 + 1;
                      }
                      while (iVar27 != 0) {
                        *pauVar10 = auVar3;
                        pauVar10 = pauVar10 + 1;
                        iVar27 = iVar27 + -1;
                      }
                    }
                    pauVar20 = (undefined1 (*) [32])((long)pauVar20 + (long)(m.w << 3) * -4);
                    iVar23 = 0;
                    if (iVar4 < 1) {
                      iVar4 = iVar23;
                    }
                    for (; iVar23 != iVar4; iVar23 = iVar23 + 1) {
                      auVar3 = *pauVar20;
                      iVar24 = iVar9;
                      while (bVar32 = iVar24 != 0, iVar24 = iVar24 + -1, bVar32) {
                        *pauVar10 = auVar3;
                        pauVar10 = pauVar10 + 1;
                      }
                      lVar28 = 0;
                      for (iVar24 = 0; iVar24 < m.w; iVar24 = iVar24 + 1) {
                        auVar3 = *(undefined1 (*) [32])(*pauVar20 + lVar28);
                        *(undefined1 (*) [32])(*pauVar10 + lVar28) = auVar3;
                        lVar28 = lVar28 + 0x20;
                      }
                      pauVar10 = (undefined1 (*) [32])(*pauVar10 + lVar28);
                      iVar24 = iVar16;
                      while (bVar32 = iVar24 != 0, iVar24 = iVar24 + -1, bVar32) {
                        *pauVar10 = auVar3;
                        pauVar10 = pauVar10 + 1;
                      }
                    }
                    p_Var22 = pp_Var7[-3];
                    iVar4 = *(int *)(&this->field_0xe0 + (long)p_Var22);
                  }
                  if (iVar4 == 2) {
                    iVar4 = *(int *)(&this->field_0xd0 + (long)p_Var22);
                    uVar5 = *(uint *)(&this->field_0xd8 + (long)p_Var22);
                    pauVar10 = (undefined1 (*) [32])((long)(m.w * iVar4 * 8) * 4 + (long)m.data);
                    uVar19 = 0;
                    uVar12 = 0;
                    if (0 < (int)uVar5) {
                      uVar12 = (ulong)uVar5;
                    }
                    uVar17 = (ulong)*(uint *)(&this->field_0xdc + (long)p_Var22);
                    if ((int)*(uint *)(&this->field_0xdc + (long)p_Var22) < 1) {
                      uVar17 = uVar19;
                    }
                    iVar9 = *(int *)(&this->field_0xd4 + (long)p_Var22);
                    if (iVar4 < 1) {
                      iVar4 = 0;
                    }
                    lVar28 = uVar12 * 0x20;
                    lVar18 = uVar17 * 0x20;
                    pauVar20 = (undefined1 (*) [32])bottom_blob_unpacked.data;
                    for (; (int)uVar19 != iVar4; uVar19 = (ulong)((int)uVar19 + 1)) {
                      lVar29 = 0;
                      for (lVar30 = 0; lVar28 + lVar30 != 0; lVar30 = lVar30 + -0x20) {
                        *(undefined1 (*) [32])(*pauVar20 + lVar29) =
                             *(undefined1 (*) [32])(pauVar10[(int)uVar5] + lVar30);
                        lVar29 = lVar29 + 0x20;
                      }
                      pauVar20 = (undefined1 (*) [32])((long)pauVar20 - lVar30);
                      pauVar25 = pauVar10;
                      for (iVar23 = 0; lVar29 = lVar15, iVar23 < m.w; iVar23 = iVar23 + 1) {
                        *pauVar20 = *pauVar25;
                        pauVar25 = pauVar25 + 1;
                        pauVar20 = pauVar20 + 1;
                      }
                      for (; lVar18 + lVar29 != -0x40; lVar29 = lVar29 + -0x20) {
                        *pauVar20 = *(undefined1 (*) [32])(*pauVar25 + lVar29);
                        pauVar20 = pauVar20 + 1;
                      }
                      pauVar10 = pauVar10 + -(long)m.w;
                    }
                    for (iVar4 = 0; iVar4 < m.h; iVar4 = iVar4 + 1) {
                      lVar30 = 0;
                      for (lVar29 = 0; lVar28 + lVar29 != 0; lVar29 = lVar29 + -0x20) {
                        *(undefined1 (*) [32])(*pauVar20 + lVar30) =
                             *(undefined1 (*) [32])(pauVar10[(int)uVar5] + lVar29);
                        lVar30 = lVar30 + 0x20;
                      }
                      pauVar20 = (undefined1 (*) [32])((long)pauVar20 - lVar29);
                      for (iVar23 = 0; lVar29 = lVar15, iVar23 < m.w; iVar23 = iVar23 + 1) {
                        *pauVar20 = *pauVar10;
                        pauVar10 = pauVar10 + 1;
                        pauVar20 = pauVar20 + 1;
                      }
                      for (; lVar18 + lVar29 != -0x40; lVar29 = lVar29 + -0x20) {
                        *pauVar20 = *(undefined1 (*) [32])(*pauVar10 + lVar29);
                        pauVar20 = pauVar20 + 1;
                      }
                    }
                    pauVar10 = pauVar10 + (long)m.w * -2;
                    iVar4 = 0;
                    if (iVar9 < 1) {
                      iVar9 = iVar4;
                    }
                    for (; iVar4 != iVar9; iVar4 = iVar4 + 1) {
                      lVar30 = 0;
                      for (lVar29 = 0; lVar28 + lVar29 != 0; lVar29 = lVar29 + -0x20) {
                        *(undefined1 (*) [32])(*pauVar20 + lVar30) =
                             *(undefined1 (*) [32])(pauVar10[(int)uVar5] + lVar29);
                        lVar30 = lVar30 + 0x20;
                      }
                      pauVar20 = (undefined1 (*) [32])((long)pauVar20 - lVar29);
                      pauVar25 = pauVar10;
                      for (iVar23 = 0; lVar29 = lVar15, iVar23 < m.w; iVar23 = iVar23 + 1) {
                        *pauVar20 = *pauVar25;
                        pauVar25 = pauVar25 + 1;
                        pauVar20 = pauVar20 + 1;
                      }
                      for (; lVar18 + lVar29 != -0x40; lVar29 = lVar29 + -0x20) {
                        *pauVar20 = *(undefined1 (*) [32])(*pauVar25 + lVar29);
                        pauVar20 = pauVar20 + 1;
                      }
                      pauVar10 = pauVar10 + -(long)m.w;
                    }
                  }
                  Mat::~Mat(&m);
                }
                Mat::~Mat(&bottom_blob_unpacked);
              }
              return 0;
            }
            return -100;
          }
        }
        break;
      case 4:
        if (*(int *)(&this->field_0xe0 + (long)p_Var22) == 0) {
          iVar4 = *(int *)(&this->field_0xe8 + (long)p_Var22) + iVar23 +
                  *(int *)(&this->field_0xec + (long)p_Var22);
          Mat::create(top_blob,iVar14 + *(int *)(&this->field_0xd8 + (long)p_Var22) +
                               *(int *)(&this->field_0xdc + (long)p_Var22),
                      uVar5 + iVar9 + *(int *)(&this->field_0xd4 + (long)p_Var22),iVar4,_c,uVar31,8,
                      opt->blob_allocator);
          if (top_blob->data == (void *)0x0) {
            return -100;
          }
          if ((long)top_blob->c * top_blob->cstep != 0) {
            if (iVar4 < 1) {
              iVar4 = 0;
            }
            if (_c < 1) {
              _c = 0;
            }
            uVar39 = 0;
            pMVar38 = top_blob;
            for (lVar15 = 0; lVar15 != CONCAT44(uVar39,_c); lVar15 = lVar15 + 1) {
              for (iVar14 = 0; iVar4 != iVar14; iVar14 = iVar14 + 1) {
                Mat::channel(&m,top_blob,(int)lVar15);
                Mat::depth(&bottom_blob_unpacked,&m,iVar14);
                Mat::~Mat(&m);
                iVar9 = iVar14 - *(int *)(&this->field_0xe8 + (long)this->_vptr_Padding_x86_avx2[-3]
                                         );
                if (iVar9 < 0 || iVar23 <= iVar9) {
                  _v_00._8_8_ = pMVar38;
                  _v_00._0_8_ = this;
                  _v_00[4] = (float)_c;
                  _v_00[5] = (float)uVar39;
                  _v_00._24_8_ = bottom_blob;
                  Mat::fill(&bottom_blob_unpacked,_v_00);
                  top_blob = pMVar38;
                }
                else {
                  Mat::channel(&local_78,bottom_blob,(int)lVar15);
                  pPVar37 = this;
                  Mat::depth(&m,&local_78,
                             iVar14 - *(int *)(&this->field_0xe8 +
                                              (long)this->_vptr_Padding_x86_avx2[-3]));
                  Mat::~Mat(&local_78);
                  p_Var22 = this->_vptr_Padding_x86_avx2[-3];
                  v_01._8_8_ = pMVar38;
                  v_01._0_8_ = pPVar37;
                  v_01[4] = (float)_c;
                  v_01[5] = (float)uVar39;
                  v_01._24_8_ = bottom_blob;
                  padding_constant_pack8_avx
                            (&m,&bottom_blob_unpacked,*(int *)(&this->field_0xd0 + (long)p_Var22),
                             *(int *)(&this->field_0xd4 + (long)p_Var22),
                             *(int *)(&this->field_0xd8 + (long)p_Var22),
                             *(int *)(&this->field_0xdc + (long)p_Var22),v_01);
                  Mat::~Mat(&m);
                  this = pPVar37;
                  top_blob = pMVar38;
                }
                Mat::~Mat(&bottom_blob_unpacked);
                pMVar38 = top_blob;
              }
            }
            return 0;
          }
          return -100;
        }
      }
    }
  }
  Mat::Mat(&bottom_blob_unpacked,bottom_blob);
  if (iVar4 != 1) {
    m.data = *(void **)opt;
    m.elemsize = (size_t)opt->workspace_allocator;
    m.elempack = opt->openmp_blocktime;
    m._28_1_ = opt->use_winograd_convolution;
    m._29_1_ = opt->use_sgemm_convolution;
    m._30_1_ = opt->use_int8_inference;
    m._31_1_ = opt->use_vulkan_compute;
    m.allocator = *(Allocator **)&opt->use_bf16_storage;
    m._40_8_ = *(undefined8 *)&opt->use_shader_pack8;
    m._48_8_ = *(undefined8 *)&opt->flush_denormals;
    m._56_8_ = *(undefined8 *)&opt->use_reserved_4;
    m.refcount = (int *)opt->workspace_allocator;
    convert_packing(bottom_blob,&bottom_blob_unpacked,1,(Option *)&m);
  }
  iVar4 = Padding::forward((Padding *)
                           ((long)&this->_vptr_Padding_x86_avx2 +
                           (long)this->_vptr_Padding_x86_avx2[-3]),&bottom_blob_unpacked,top_blob,
                           opt);
  Mat::~Mat(&bottom_blob_unpacked);
  return iVar4;
}

Assistant:

int Padding_x86_avx2::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    if (top == 0 && bottom == 0 && left == 0 && right == 0 && front == 0 && behind == 0)
    {
        top_blob = bottom_blob;
        return 0;
    }

    int elembits = bottom_blob.elembits();

    if (elembits == 8)
        return forward_int8(bottom_blob, top_blob, opt);

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

#if __SSE2__
#if __AVX__
    if (elempack == 8)
    {
        if (dims == 1)
        {
            int outw = w * elempack + left + right;

            int out_elempack = outw % 8 == 0 ? 8 : outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (left % 8 == 0 && out_elempack == 8 && type == 0)
            {
                top_blob.create(outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m256 pad_value = _mm256_set1_ps(value);
                padding_constant_pack8_avx(bottom_blob, top_blob, 0, 0, left / 8, right / 8, pad_value);

                return 0;
            }
        }

        if (dims == 2)
        {
            int outw = w + left + right;
            int outh = h * elempack + top + bottom;

            int out_elempack = outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (top % 8 == 0 && out_elempack == 8 && type == 0)
            {
                top_blob.create(outw, outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m256 pad_value = _mm256_set1_ps(value);
                padding_constant_pack8_avx(bottom_blob, top_blob, top / 8, bottom / 8, left, right, pad_value);

                return 0;
            }
        }

        if (dims == 3)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outc = channels * elempack + front + behind;

            int out_elempack = outc % 8 == 0 ? 8 : outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (front % 8 == 0 && out_elempack == 8 && !(outc != channels * elempack && type != 0))
            {
                top_blob.create(outw, outh, outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int front_ = front / elempack;
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < outc / out_elempack; q++)
                {
                    Mat borderm = top_blob.channel(q);

                    __m256 pad_value = per_channel_pad_data_size ? _mm256_loadu_ps((const float*)per_channel_pad_data + q * 8) : _mm256_set1_ps(value);
                    //Channel padding
                    if ((q - front_) < 0 || (q - front_) >= channels)
                    {
                        borderm.fill(pad_value);
                    }
                    else
                    {
                        const Mat m = bottom_blob.channel(q - front_);
                        if (type == 0)
                            padding_constant_pack8_avx(m, borderm, top, bottom, left, right, pad_value);
                        if (type == 1)
                            padding_replicate_pack8_avx(m, borderm, top, bottom, left, right);
                        if (type == 2)
                            padding_reflect_pack8_avx(m, borderm, top, bottom, left, right);
                    }
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outd = d + front + behind;

            if (type == 0)
            {
                top_blob.create(outw, outh, outd, channels, elemsize, elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    __m256 pad_value = per_channel_pad_data_size ? _mm256_loadu_ps((const float*)per_channel_pad_data + q * 8) : _mm256_set1_ps(value);

                    for (int z = 0; z < outd; z++)
                    {
                        Mat borderm = top_blob.channel(q).depth(z);

                        // depth padding
                        if ((z - front) < 0 || (z - front) >= d)
                        {
                            borderm.fill(pad_value);
                        }
                        else
                        {
                            const Mat m = bottom_blob.channel(q).depth(z - front);
                            padding_constant_pack8_avx(m, borderm, top, bottom, left, right, pad_value);
                        }
                    }
                }

                return 0;
            }
        }
    }
#endif // __AVX__

    if (elempack == 4)
    {
        if (dims == 1)
        {
            int outw = w * elempack + left + right;

#if __AVX__
            int out_elempack = outw % 8 == 0 ? 8 : outw % 4 == 0 ? 4 : 1;
#else
            int out_elempack = outw % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (left % 4 == 0 && out_elempack == 4 && type == 0)
            {
                top_blob.create(outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m128 pad_value = _mm_set1_ps(value);
                padding_constant_pack4_sse(bottom_blob, top_blob, 0, 0, left / 4, right / 4, pad_value);

                return 0;
            }
        }

        if (dims == 2)
        {
            int outw = w + left + right;
            int outh = h * elempack + top + bottom;

#if __AVX__
            int out_elempack = outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
#else
            int out_elempack = outh % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (top % 4 == 0 && out_elempack == 4 && type == 0)
            {
                top_blob.create(outw, outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m128 pad_value = _mm_set1_ps(value);
                padding_constant_pack4_sse(bottom_blob, top_blob, top / 4, bottom / 4, left, right, pad_value);

                return 0;
            }
        }

        if (dims == 3)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outc = channels * elempack + front + behind;

#if __AVX__
            int out_elempack = outc % 8 == 0 ? 8 : outc % 4 == 0 ? 4 : 1;
#else
            int out_elempack = outc % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (front % 4 == 0 && out_elempack == 4 && !(outc != channels * elempack && type != 0))
            {
                top_blob.create(outw, outh, outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int front_ = front / elempack;
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < outc / out_elempack; q++)
                {
                    Mat borderm = top_blob.channel(q);

                    __m128 pad_value = per_channel_pad_data_size ? _mm_loadu_ps((const float*)per_channel_pad_data + q * 4) : _mm_set1_ps(value);
                    //Channel padding
                    if ((q - front_) < 0 || (q - front_) >= channels)
                    {
                        borderm.fill(pad_value);
                    }
                    else
                    {
                        const Mat m = bottom_blob.channel(q - front_);
                        if (type == 0)
                            padding_constant_pack4_sse(m, borderm, top, bottom, left, right, pad_value);
                        if (type == 1)
                            padding_replicate_pack4_sse(m, borderm, top, bottom, left, right);
                        if (type == 2)
                            padding_reflect_pack4_sse(m, borderm, top, bottom, left, right);
                    }
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outd = d + front + behind;

            if (type == 0)
            {
                top_blob.create(outw, outh, outd, channels, elemsize, elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    __m128 pad_value = per_channel_pad_data_size ? _mm_loadu_ps((const float*)per_channel_pad_data + q * 4) : _mm_set1_ps(value);

                    for (int z = 0; z < outd; z++)
                    {
                        Mat borderm = top_blob.channel(q).depth(z);

                        // depth padding
                        if ((z - front) < 0 || (z - front) >= d)
                        {
                            borderm.fill(pad_value);
                        }
                        else
                        {
                            const Mat m = bottom_blob.channel(q).depth(z - front);
                            padding_constant_pack4_sse(m, borderm, top, bottom, left, right, pad_value);
                        }
                    }
                }

                return 0;
            }
        }
    }
#endif // __SSE2__

    Mat bottom_blob_unpacked = bottom_blob;
    if (elempack != 1)
    {
        Option opt_pack1 = opt;
        opt_pack1.blob_allocator = opt.workspace_allocator;

        convert_packing(bottom_blob, bottom_blob_unpacked, 1, opt_pack1);
    }

    return Padding::forward(bottom_blob_unpacked, top_blob, opt);
}